

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

SUNErrCode SUNMatHermitianTransposeVec_Band(SUNMatrix A,N_Vector x,N_Vector y)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  lVar5 = N_VGetArrayPointer(x);
  lVar6 = N_VGetArrayPointer(y);
  plVar1 = (long *)A->content;
  lVar2 = *plVar1;
  lVar7 = 0;
  lVar8 = 0;
  if (0 < lVar2) {
    lVar8 = lVar2;
  }
  for (; lVar8 != lVar7; lVar7 = lVar7 + 1) {
    *(undefined8 *)(lVar6 + lVar7 * 8) = 0;
  }
  lVar8 = plVar1[1];
  if (plVar1[1] < 1) {
    lVar8 = 0;
  }
  lVar7 = 0;
  for (lVar9 = 0; lVar9 != lVar8; lVar9 = lVar9 + 1) {
    lVar3 = plVar1[5];
    lVar10 = lVar9 - plVar1[3];
    if (lVar9 - plVar1[3] < 1) {
      lVar10 = 0;
    }
    lVar11 = plVar1[4] + lVar9;
    if (lVar2 <= plVar1[4] + lVar9) {
      lVar11 = lVar2 + -1;
    }
    lVar4 = *(long *)(plVar1[8] + lVar9 * 8);
    for (; lVar10 <= lVar11; lVar10 = lVar10 + 1) {
      *(double *)(lVar6 + lVar9 * 8) =
           *(double *)(lVar7 + lVar3 * 8 + lVar4 + lVar10 * 8) * *(double *)(lVar5 + lVar10 * 8) +
           *(double *)(lVar6 + lVar9 * 8);
    }
    lVar7 = lVar7 + -8;
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatHermitianTransposeVec_Band(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, is, ie;
  sunrealtype *col_j, *xd, *yd;

  SUNCheck(compatibleMatrixAndVectors(A, y, x), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);

  /* Perform operation */
  for (i = 0; i < SM_ROWS_B(A); i++) { yd[i] = ZERO; }
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    col_j = SM_COLUMN_B(A, j);
    is    = SUNMAX(0, j - SM_UBAND_B(A));
    ie    = SUNMIN(SM_ROWS_B(A) - 1, j + SM_LBAND_B(A));
    for (i = is; i <= ie; i++) { yd[j] += col_j[i - j] * xd[i]; }
  }
  return SUN_SUCCESS;
}